

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderPass>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IRenderPass> *this,IRenderPass *pObj)

{
  int iVar1;
  undefined4 extraout_var;
  RefCountersImpl *pRVar2;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (pObj != (IRenderPass *)0x0) {
    iVar1 = (*(pObj->super_IDeviceObject).super_IObject._vptr_IObject[3])(pObj);
    pRVar2 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                       ((IReferenceCounters *)CONCAT44(extraout_var,iVar1));
    this->m_pRefCounters = pRVar2;
    LOCK();
    (pRVar2->m_NumWeakReferences).super___atomic_base<int>._M_i =
         (pRVar2->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }